

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::glslAssignBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 uVar6;
  int iVar7;
  string indentation;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  DataType local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = glu::getDataTypeScalarSize(type);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)indentationDepth);
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_a0,&local_50,name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_b0 = *plVar4;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar4;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
  uVar6 = extraout_RDX;
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
    uVar6 = extraout_RDX_00;
  }
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    uVar6 = extraout_RDX_01;
  }
  if (type != TYPE_FLOAT) {
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    glu::getDataTypeName(type);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0.field_2._8_8_ = plVar3[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_b0 = *plVar4;
      lStack_a8 = plVar3[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar4;
      local_c0 = (long *)*plVar3;
    }
    local_b8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
    uVar6 = extraout_RDX_02;
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
      uVar6 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      uVar6 = extraout_RDX_04;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
      uVar6 = extraout_RDX_05;
    }
  }
  local_7c = type;
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      if (iVar7 == 0) {
        local_c0 = &local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"v","");
      }
      else {
        de::floatToString_abi_cxx11_(&local_a0,(de *)&DAT_00000001,(float)iVar7 * 0.8,(int)uVar6);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x1c4bbf9);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_b0 = *plVar4;
          lStack_a8 = plVar3[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar4;
          local_c0 = (long *)*plVar3;
        }
        local_b8 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
      uVar6 = extraout_RDX_06;
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
        uVar6 = extraout_RDX_07;
      }
      if ((iVar7 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        uVar6 = extraout_RDX_08;
      }
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  if (local_7c != TYPE_FLOAT) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::operator+(&local_70,";\n",&local_50);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_b0 = *plVar4;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar4;
    local_c0 = (long *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::glslAssignBasicTypeObject (const string& name, glu::DataType type, int indentationDepth)
{
	const int		scalarSize		= glu::getDataTypeScalarSize(type);
	const string	indentation		= string(indentationDepth, '\t');
	string			result;

	result += indentation + name + " = ";

	if (type != glu::TYPE_FLOAT)
		result += string() + glu::getDataTypeName(type) + "(";
	for (int i = 0; i < scalarSize; i++)
		result += (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1)
						 : "v");
	if (type != glu::TYPE_FLOAT)
		result += ")";
	result += ";\n" +
			  indentation + "v += 0.4;\n";
	return result;
}